

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_with_opts.c
# Opt level: O3

void parse_with_opts_should_handle_incomplete_json(void)

{
  size_t sVar1;
  cJSON *pcVar2;
  long in_FS_OFFSET;
  char *parse_end;
  char json [11];
  char *local_30;
  char local_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  builtin_strncpy(local_28,"{ \"name\": ",0xb);
  local_30 = (char *)0x0;
  sVar1 = strlen(local_28);
  pcVar2 = cJSON_ParseWithLengthOpts(local_28,sVar1 + 1,&local_30,0);
  if (pcVar2 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x39);
  }
  UnityAssertEqualNumber
            ((UNITY_INT)(local_28 + 10),(UNITY_INT)local_30,(char *)0x0,0x3a,
             UNITY_DISPLAY_STYLE_HEX64);
  UnityAssertEqualNumber
            ((UNITY_INT)(local_28 + 10),global_error_0 + global_error_1,(char *)0x0,0x3b,
             UNITY_DISPLAY_STYLE_HEX64);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void parse_with_opts_should_handle_incomplete_json(void)
{
    const char json[] = "{ \"name\": ";
    const char *parse_end = NULL;

    TEST_ASSERT_NULL(cJSON_ParseWithOpts(json, &parse_end, false));
    TEST_ASSERT_EQUAL_PTR(json + strlen(json), parse_end);
    TEST_ASSERT_EQUAL_PTR(json + strlen(json), cJSON_GetErrorPtr());
}